

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

FuncInfo *
PreVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,
                ParseableFunctionInfo *reuseNestedFunc)

{
  undefined1 *puVar1;
  Type *pTVar2;
  ushort uVar3;
  FncFlags FVar4;
  IdentPtr pIVar5;
  code *pcVar6;
  ByteCodeGenerator *this;
  bool bVar7;
  bool bVar8;
  FuncInfo *this_00;
  ParseNodeFnc *pPVar9;
  size_t sVar10;
  undefined4 *puVar11;
  ParseNodeVar *pPVar12;
  FuncInfo *func;
  FunctionBody *pFVar13;
  ParseNode *this_01;
  byte bVar14;
  uint32 nameLength;
  char16 *string;
  uint16 local_42;
  ByteCodeGenerator *pBStack_40;
  ArgSlot pos;
  uint32 local_38;
  bool local_31 [8];
  bool funcExprWithName;
  
  this_00 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  bVar7 = false;
  pBStack_40 = byteCodeGenerator;
  if ((byteCodeGenerator->flags & 0x1000) == 0) {
    bVar7 = FuncInfo::IsGlobalFunction(this_00);
    if (bVar7) {
      pPVar9 = (ParseNodeFnc *)ParseNodeFnc::GetParamScope(this_00->root);
      bVar7 = pPVar9 == pnodeFnc;
    }
    else {
      bVar7 = false;
    }
  }
  local_31[0] = false;
  string = pnodeFnc->hint;
  if (string == (char16_t *)0x0) {
    local_38 = 0;
    string = L"Anonymous function";
    nameLength = 0x12;
  }
  else {
    nameLength = pnodeFnc->hintLength;
    local_38 = pnodeFnc->hintOffset;
    if (nameLength == 0) {
      sVar10 = PAL_wcslen(string);
      nameLength = 0;
      if ((int)sVar10 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x9b3,
                           "(funcNameLength != 0 || funcNameLength == (int)PAL_wcslen(funcName))",
                           "funcNameLength != 0 || funcNameLength == (int)wcslen(funcName)");
        if (!bVar8) goto LAB_0077f8be;
        *puVar11 = 0;
      }
    }
  }
  FVar4 = pnodeFnc->fncFlags;
  if ((FVar4 & (kFunctionIsMethod|kFunctionDeclaration)) == kFunctionNone) {
    pPVar12 = pnodeFnc->pnodeName;
    if (pPVar12 == (ParseNodeVar *)0x0) {
      if ((FVar4 >> 10 & 1) == 0) goto LAB_0077f572;
      string = L"Module code";
      nameLength = 0xb;
    }
    else {
      if ((pPVar12->super_ParseNode).nop != knopVarDecl) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x9c1,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                           "pnodeFnc->pnodeName->nop == knopVarDecl");
        if (!bVar8) goto LAB_0077f8be;
        *puVar11 = 0;
        pPVar12 = pnodeFnc->pnodeName;
      }
      nameLength = pPVar12->pid->m_cch;
      string = (char16 *)&pPVar12->pid->field_0x22;
      local_31[0] = true;
    }
    local_38 = 0;
  }
  else {
    pIVar5 = pnodeFnc->pid;
    if ((FVar4 >> 0x14 & 1) == 0 && pIVar5 != (IdentPtr)0x0) {
      nameLength = pIVar5->m_cch;
      string = (char16 *)&pIVar5->field_0x22;
      local_38 = 0;
    }
  }
LAB_0077f572:
  bVar8 = ByteCodeGenerator::Trace(pBStack_40);
  if (bVar8) {
    Output::Print(L"function start %s\n",string);
  }
  if (pnodeFnc->funcInfo != (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x9d6,"(pnodeFnc->funcInfo == nullptr)","pnodeFnc->funcInfo == nullptr");
    if (!bVar8) {
LAB_0077f8be:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar11 = 0;
  }
  func = ByteCodeGenerator::StartBindFunction
                   (pBStack_40,string,nameLength,local_38,local_31,pnodeFnc,reuseNestedFunc);
  pnodeFnc->funcInfo = func;
  *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
       *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xffdf |
       (ushort)local_31[0] << 5;
  *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
       *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xffbf |
       (ushort)pnodeFnc->isNameIdentifierRef << 6;
  if (bVar7) {
    ByteCodeGenerator::SetRootFuncInfo(pBStack_40,func);
  }
  if (pnodeFnc->pnodeBody == (ParseNodePtr)0x0) {
    local_42 = 1;
    for (this_01 = pnodeFnc->pnodeParams; this_01 != (ParseNode *)0x0;
        this_01 = ParseNode::GetFormalNext(this_01)) {
      UInt16Math::Inc(&local_42);
    }
    ByteCodeGenerator::SetNumberOfInArgs(pBStack_40,local_42);
    return func;
  }
  FVar4 = pnodeFnc->fncFlags;
  if ((FVar4 & kFunctionHasReferenceableBuiltInArguments) == kFunctionNone) goto LAB_0077f836;
  if ((FVar4 & kFunctionCallsEval) == kFunctionNone) {
    if ((FVar4 & kFunctionUsesArguments) == kFunctionNone) goto LAB_0077f836;
    func->field_0xb4 = func->field_0xb4 | 8;
    pFVar13 = FuncInfo::GetParsedFunctionBody(func);
    uVar3 = *(ushort *)&(pFVar13->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
    if (-1 < (short)uVar3) {
      *(ushort *)&(pFVar13->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
           uVar3 | 0x8000;
    }
    bVar14 = 1;
    if ((int)pnodeFnc->fncFlags < 0) {
      bVar14 = (func->byteCodeFunction->super_FunctionProxy).field_0x46 & 1;
    }
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PerfHintPhase);
    if ((bVar14 == 0) && (bVar7)) {
      pFVar13 = FuncInfo::GetParsedFunctionBody(func);
      WritePerfHint(HeapArgumentsDueToWriteToFormals,pFVar13,0);
    }
    if (bVar14 == 0) {
LAB_0077f7af:
      bVar14 = 0;
    }
    else {
      bVar14 = 1;
      if ((1 < pnodeFnc->funcInfo->paramScope->m_count) &&
         (((((pBStack_40->flags & 0x400) != 0 ||
            ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone)) ||
           (bVar7 = ByteCodeGenerator::IsInDebugMode(pBStack_40), bVar7)) ||
          ((bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,StackArgFormalsOptPhase), bVar7 ||
           (bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,StackArgOptPhase), bVar7)))))) {
        bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PerfHintPhase);
        if (bVar7) {
          if ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone) {
            pFVar13 = FuncInfo::GetParsedFunctionBody(func);
            WritePerfHint(HasWithBlock,pFVar13,0);
          }
          if ((pBStack_40->flags & 0x400) != 0) {
            pFVar13 = FuncInfo::GetParsedFunctionBody(func);
            bVar14 = 0;
            WritePerfHint(SrcIsEval,pFVar13,0);
            goto LAB_0077f7b2;
          }
        }
        goto LAB_0077f7af;
      }
    }
LAB_0077f7b2:
    FuncInfo::SetHasHeapArguments
              (func,true,
               (bool)((pnodeFnc->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) ==
                      kFunctionNone & bVar14));
  }
  else {
    func->field_0xb4 = func->field_0xb4 | 0x18;
    puVar1 = &(func->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
  }
  if (func->inArgsCount == 0) {
    ByteCodeGenerator::AssignNullConstRegister(pBStack_40);
  }
LAB_0077f836:
  pFVar13 = FuncInfo::GetParsedFunctionBody(this_00);
  if (((func->field_0xb4 & 8) != 0) ||
     (((pFVar13->super_ParseableFunctionInfo).flags & Flags_HasOrParentHasArguments) != Flags_None))
  {
    pFVar13 = FuncInfo::GetParsedFunctionBody(func);
    pTVar2 = &(pFVar13->super_ParseableFunctionInfo).flags;
    *pTVar2 = *pTVar2 | Flags_HasOrParentHasArguments;
  }
  this = pBStack_40;
  PreVisitBlock(pnodeFnc->pnodeScopes,pBStack_40);
  bVar7 = ByteCodeGenerator::NeedScopeObjectForArguments(this,func,func->root);
  AddArgsToScope(pnodeFnc,this,!bVar7);
  return func;
}

Assistant:

FuncInfo* PreVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator, Js::ParseableFunctionInfo *reuseNestedFunc)
{
    // Do binding of function name(s), initialize function scope, propagate function-wide properties from
    // the parent (if any).
    FuncInfo* parentFunc = byteCodeGenerator->TopFuncInfo();

    // fIsRoot indicates that this is the root function to be returned to a ParseProcedureText/AddScriptLet/etc. call.
    // In such cases, the global function is just a wrapper around the root function's declaration.
    // We used to assert that this was the only top-level function body, but it's possible to trick
    // "new Function" into compiling more than one function (see WOOB 1121759).
    bool fIsRoot = (!(byteCodeGenerator->GetFlags() & fscrGlobalCode) &&
        parentFunc->IsGlobalFunction() &&
        parentFunc->root->GetTopLevelScope() == pnodeFnc);

    const char16 *funcName = Js::Constants::AnonymousFunction;
    uint funcNameLength = Js::Constants::AnonymousFunctionLength;
    uint functionNameOffset = 0;
    bool funcExprWithName = false;

    if (pnodeFnc->hint != nullptr)
    {
        funcName = reinterpret_cast<const char16*>(pnodeFnc->hint);
        funcNameLength = pnodeFnc->hintLength;
        functionNameOffset = pnodeFnc->hintOffset;
        Assert(funcNameLength != 0 || funcNameLength == (int)wcslen(funcName));
    }
    if (pnodeFnc->IsDeclaration() || pnodeFnc->IsMethod())
    {
        // Class members have the fully qualified name stored in 'hint', no need to replace it.
        if (pnodeFnc->pid && !pnodeFnc->IsClassMember())
        {
            funcName = reinterpret_cast<const char16*>(pnodeFnc->pid->Psz());
            funcNameLength = pnodeFnc->pid->Cch();
            functionNameOffset = 0;
        }
    }
    else if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        funcName = reinterpret_cast<const char16*>(pnodeFnc->pnodeName->pid->Psz());
        funcNameLength = pnodeFnc->pnodeName->pid->Cch();
        functionNameOffset = 0;
        //
        // create the new scope for Function expression only in ES5 mode
        //
        funcExprWithName = true;
    }
    else if (pnodeFnc->IsModule())
    {
        funcName = Js::Constants::ModuleCode;
        funcNameLength = Js::Constants::ModuleCodeLength;
        functionNameOffset = 0;
    }

    if (byteCodeGenerator->Trace())
    {
        Output::Print(_u("function start %s\n"), funcName);
    }

    Assert(pnodeFnc->funcInfo == nullptr);
    FuncInfo* funcInfo = pnodeFnc->funcInfo = byteCodeGenerator->StartBindFunction(funcName, funcNameLength, functionNameOffset, &funcExprWithName, pnodeFnc, reuseNestedFunc);
    funcInfo->byteCodeFunction->SetIsNamedFunctionExpression(funcExprWithName);
    funcInfo->byteCodeFunction->SetIsNameIdentifierRef(pnodeFnc->isNameIdentifierRef);

    if (fIsRoot)
    {
        byteCodeGenerator->SetRootFuncInfo(funcInfo);
    }

    if (pnodeFnc->pnodeBody == nullptr)
    {
        // This is a deferred byte code gen, so we're done.
        // Process the formal arguments, even if there's no AST for the body, to support Function.length.
        Js::ArgSlot pos = 1;
        // We skip the rest parameter here because it is not counted towards the in arg count.
        MapFormalsWithoutRest(pnodeFnc, [&](ParseNode *pnode) { ArgSlotMath::Inc(pos); });
        byteCodeGenerator->SetNumberOfInArgs(pos);
        return funcInfo;
    }

    if (pnodeFnc->HasReferenceableBuiltInArguments())
    {
        // The parser identified that there is a way to reference the built-in 'arguments' variable from this function. So, we
        // need to determine whether we need to create the variable or not. We need to create the variable iff:
        if (pnodeFnc->CallsEval())
        {
            // 1. eval is called.
            // 2. when the debugging is enabled, since user can seek arguments during breakpoint.
            funcInfo->SetHasArguments(true);
            funcInfo->SetHasHeapArguments(true);
            if (funcInfo->inArgsCount == 0)
            {
                // If no formals to function, no need to create the propertyid array
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        else if (pnodeFnc->UsesArguments())
        {
            // 3. the function directly references an 'arguments' identifier
            funcInfo->SetHasArguments(true);
            funcInfo->GetParsedFunctionBody()->SetUsesArgumentsObject(true);
            if (pnodeFnc->HasHeapArguments())
            {
                bool doStackArgsOpt = (!pnodeFnc->HasAnyWriteToFormals() || funcInfo->GetIsStrictMode());
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase) && !doStackArgsOpt)
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToWriteToFormals, funcInfo->GetParsedFunctionBody(), 0);
                }
#endif

                //With statements - need scope object to be present.
                if ((doStackArgsOpt && pnodeFnc->funcInfo->GetParamScope()->Count() > 1) && ((byteCodeGenerator->GetFlags() & fscrEval) ||
                    pnodeFnc->HasWithStmt() || byteCodeGenerator->IsInDebugMode() || PHASE_OFF1(Js::StackArgFormalsOptPhase) || PHASE_OFF1(Js::StackArgOptPhase)))
                {
                    doStackArgsOpt = false;
#ifdef PERF_HINT
                    if (PHASE_TRACE1(Js::PerfHintPhase))
                    {
                        if (pnodeFnc->HasWithStmt())
                        {
                            WritePerfHint(PerfHints::HasWithBlock, funcInfo->GetParsedFunctionBody(), 0);
                        }

                        if(byteCodeGenerator->GetFlags() & fscrEval)
                        {
                            WritePerfHint(PerfHints::SrcIsEval, funcInfo->GetParsedFunctionBody(), 0);
                        }
                    }
#endif
                }
                funcInfo->SetHasHeapArguments(true, !pnodeFnc->IsCoroutine() && doStackArgsOpt /*= Optimize arguments in backend*/);
                if (funcInfo->inArgsCount == 0)
                {
                    // If no formals to function, no need to create the propertyid array
                    byteCodeGenerator->AssignNullConstRegister();
                }
            }
        }
    }

    Js::FunctionBody* parentFunctionBody = parentFunc->GetParsedFunctionBody();
    if (funcInfo->GetHasArguments() ||
        parentFunctionBody->GetHasOrParentHasArguments())
    {
        // The JIT uses this info, for instance, to narrow kills of array operations
        funcInfo->GetParsedFunctionBody()->SetHasOrParentHasArguments(true);
    }
    PreVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
    // If we have arguments, we are going to need locations if the function is in strict mode or we have a non-simple parameter list. This is because we will not create a scope object.
    bool assignLocationForFormals = !byteCodeGenerator->NeedScopeObjectForArguments(funcInfo, funcInfo->root);
    AddArgsToScope(pnodeFnc, byteCodeGenerator, assignLocationForFormals);

    return funcInfo;
}